

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

int aes128gcm_encrypt(ptls_aead_context_t *_ctx,void *_output,size_t *outlen,void *input,
                     size_t inlen,void *iv,uint8_t enc_content_type)

{
  cf_gcm_ctx gcm;
  
  cf_gcm_encrypt_init(&cf_aes,_ctx + 1,&gcm,(uint8_t *)0x0,0,(uint8_t *)iv,0xc);
  cf_gcm_encrypt_update(&gcm,(uint8_t *)input,inlen,(uint8_t *)_output);
  cf_gcm_encrypt_update(&gcm,&enc_content_type,1,(uint8_t *)((long)_output + inlen));
  cf_gcm_encrypt_final(&gcm,(uint8_t *)((long)_output + inlen + 1),0x10);
  *outlen = inlen + 0x11;
  return 0;
}

Assistant:

static int aes128gcm_encrypt(ptls_aead_context_t *_ctx, void *_output, size_t *outlen, const void *input, size_t inlen,
                             const void *iv, uint8_t enc_content_type)
{
    struct aes128gcm_context_t *ctx = (struct aes128gcm_context_t *)_ctx;
    uint8_t *output = (uint8_t *)_output;
    cf_gcm_ctx gcm;

    cf_gcm_encrypt_init(&cf_aes, &ctx->ctx, &gcm, NULL, 0, iv, AES128GCM_IV_SIZE);
    cf_gcm_encrypt_update(&gcm, input, inlen, output);
    output += inlen;
    cf_gcm_encrypt_update(&gcm, &enc_content_type, 1, output);
    output += 1;
    cf_gcm_encrypt_final(&gcm, output, AES128GCM_TAG_SIZE);
    output += AES128GCM_TAG_SIZE;

    *outlen = output - (uint8_t *)_output;
    return 0;
}